

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t cmp_key_mbs(archive_rb_node *n,void *key)

{
  char *local_30;
  char *p;
  match_file *f;
  void *key_local;
  archive_rb_node *n_local;
  
  p = (char *)n;
  f = (match_file *)key;
  key_local = n;
  archive_mstring_get_mbs((archive *)0x0,(archive_mstring *)(n[1].rb_nodes + 1),&local_30);
  if (local_30 == (char *)0x0) {
    n_local._4_4_ = L'\xffffffff';
  }
  else {
    n_local._4_4_ = strcmp(local_30,(char *)f);
  }
  return n_local._4_4_;
}

Assistant:

static int
cmp_key_mbs(const struct archive_rb_node *n, const void *key)
{
	struct match_file *f = (struct match_file *)(uintptr_t)n;
	const char *p;

	archive_mstring_get_mbs(NULL, &(f->pathname), &p);
	if (p == NULL)
		return (-1);
	return (strcmp(p, (const char *)key));
}